

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O2

char * __thiscall QGenericItemModel::index(QGenericItemModel *this,char *__s,int __c)

{
  QModelIndex *in_R8;
  long in_FS_OFFSET;
  int local_18;
  int local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = __c;
  QGenericItemModelImplBase::callConst<QModelIndex,int,int,QModelIndex>
            ((QModelIndex *)this,*(QGenericItemModelImplBase **)(__s + 0x10),Index,&local_14,
             &local_18,in_R8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (char *)this;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QGenericItemModel::index(int row, int column, const QModelIndex &parent) const
{
    return impl->callConst<QModelIndex>(QGenericItemModelImplBase::Index, row, column, parent);
}